

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::set_cpu_powersave(int powersave)

{
  uint in_EDI;
  int ret;
  CpuSet *thread_affinity_mask;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int local_4;
  
  try_initialize_global_cpu_info();
  if (((int)in_EDI < 0) || (2 < (int)in_EDI)) {
    fprintf(_stderr,"powersave %d not supported",(ulong)in_EDI);
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else {
    get_cpu_thread_affinity_mask(in_stack_ffffffffffffffec);
    local_4 = set_cpu_thread_affinity
                        ((CpuSet *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (local_4 == 0) {
      local_4 = 0;
      g_powersave = in_EDI;
    }
  }
  return local_4;
}

Assistant:

int set_cpu_powersave(int powersave)
{
    try_initialize_global_cpu_info();
    if (powersave < 0 || powersave > 2)
    {
        NCNN_LOGE("powersave %d not supported", powersave);
        return -1;
    }

    const CpuSet& thread_affinity_mask = get_cpu_thread_affinity_mask(powersave);

    int ret = set_cpu_thread_affinity(thread_affinity_mask);
    if (ret != 0)
        return ret;

    g_powersave = powersave;

    return 0;
}